

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::value::AssetPath>
          (AsciiParser *this,
          vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *result)

{
  bool bVar1;
  char c;
  
  bVar1 = Expect(this,'[');
  if ((bVar1) && (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)) {
    bVar1 = Char1(this,&c);
    if (!bVar1) {
      return bVar1;
    }
    if (c == ']') {
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::clear
                (result);
      return bVar1;
    }
    Rewind(this,1);
    bVar1 = SepBy1BasicType<tinyusdz::value::AssetPath>(this,',',']',result);
    if ((bVar1) && (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)) {
      bVar1 = Expect(this,']');
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<T> *result) {
  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1BasicType<T>(',', ']', result)) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }
  return true;
}